

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_check.cpp
# Opt level: O3

void __thiscall CalendarFixture::CalendarFixture(CalendarFixture *this)

{
  GregorianCalendar *pGVar1;
  
  (this->super_TestWithParam<int>).super_Test._vptr_Test = (_func_int **)0x0;
  (this->super_TestWithParam<int>).super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  (this->super_TestWithParam<int>).super_WithParamInterface<int>._vptr_WithParamInterface =
       (_func_int **)0x0;
  testing::Test::Test((Test *)this);
  (this->super_TestWithParam<int>).super_Test._vptr_Test =
       (_func_int **)&PTR__CalendarFixture_0016c968;
  (this->super_TestWithParam<int>).super_WithParamInterface<int>._vptr_WithParamInterface =
       (_func_int **)&DAT_0016c9a8;
  pGVar1 = (GregorianCalendar *)operator_new(0x18);
  (pGVar1->super_Calendar).year = 0x7df;
  (pGVar1->super_Calendar).month = 4;
  (pGVar1->super_Calendar).day = 0xe;
  (pGVar1->super_Calendar)._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_0016c9c8;
  this->gregorian_calendar = pGVar1;
  return;
}

Assistant:

CalendarFixture() : TestWithParam<int>() {
        gregorian_calendar = new GregorianCalendar(TEST_MONTH_GR, TEST_DAY_GR, TEST_YEAR_GR);
    }